

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ConcatenationExpression::fromEmpty
          (Compilation *compilation,EmptyQueueExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  bool bVar1;
  Expression *pEVar2;
  SourceLocation diag;
  Diagnostic *this;
  ConcatenationExpression *pCVar3;
  long in_RCX;
  SourceLocation in_RDX;
  SourceRange SVar4;
  Type *in_stack_ffffffffffffff38;
  Compilation *in_stack_ffffffffffffff40;
  uint arg;
  ASTContext *in_stack_ffffffffffffff58;
  SourceLocation in_stack_ffffffffffffff60;
  SourceLocation in_stack_ffffffffffffff68;
  DiagCode in_stack_ffffffffffffff74;
  Type *in_stack_ffffffffffffff88;
  SyntaxNode *in_stack_ffffffffffffff90;
  
  if ((in_RCX == 0) || (bVar1 = Type::isUnpackedArray(in_stack_ffffffffffffff38), !bVar1)) {
    if ((in_RCX == 0) || (bVar1 = Type::isError((Type *)0xbb6c8f), !bVar1)) {
      slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff90);
      sourceRange.endLoc = in_stack_ffffffffffffff68;
      sourceRange.startLoc = in_RDX;
      ASTContext::addDiag(in_stack_ffffffffffffff58,in_stack_ffffffffffffff74,sourceRange);
    }
    pEVar2 = Expression::badExpr(in_stack_ffffffffffffff40,(Expression *)in_stack_ffffffffffffff38);
    return pEVar2;
  }
  bVar1 = Type::isAssociativeArray((Type *)0xbb6d16);
  if (bVar1) {
    slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff90);
    SVar4.endLoc = in_stack_ffffffffffffff68;
    SVar4.startLoc = in_stack_ffffffffffffff60;
    ASTContext::addDiag((ASTContext *)in_RDX,in_stack_ffffffffffffff74,SVar4);
    pEVar2 = Expression::badExpr(in_stack_ffffffffffffff40,(Expression *)in_stack_ffffffffffffff38);
    return pEVar2;
  }
  bVar1 = Type::hasFixedRange((Type *)in_stack_ffffffffffffff40);
  if (!bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::span
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0xbb6e67);
    SVar4 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff90);
    pCVar3 = BumpAllocator::
             emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*const,18446744073709551615ul>,slang::SourceRange>
                       ((BumpAllocator *)SVar4.endLoc,(Type *)SVar4.startLoc,
                        (span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                        in_stack_ffffffffffffff60,(SourceRange *)in_stack_ffffffffffffff58);
    return &pCVar3->super_Expression;
  }
  SVar4 = slang::syntax::SyntaxNode::sourceRange(in_stack_ffffffffffffff90);
  arg = in_RDX._4_4_;
  diag = SVar4.startLoc;
  sourceRange_00.endLoc = in_stack_ffffffffffffff68;
  sourceRange_00.startLoc = in_stack_ffffffffffffff60;
  ASTContext::addDiag(in_stack_ffffffffffffff58,in_stack_ffffffffffffff74,sourceRange_00);
  this = ast::operator<<((Diagnostic *)diag,in_stack_ffffffffffffff88);
  Type::getFixedRange(in_stack_ffffffffffffff38);
  ConstantRange::width((ConstantRange *)0xbb6e13);
  Diagnostic::operator<<<unsigned_int>(this,arg);
  Diagnostic::operator<<<int>(this,arg);
  pEVar2 = Expression::badExpr(in_stack_ffffffffffffff40,(Expression *)in_stack_ffffffffffffff38);
  return pEVar2;
}

Assistant:

Expression& ConcatenationExpression::fromEmpty(Compilation& compilation,
                                               const EmptyQueueExpressionSyntax& syntax,
                                               const ASTContext& context,
                                               const Type* assignmentTarget) {
    // Empty concatenation can only target arrays.
    if (!assignmentTarget || !assignmentTarget->isUnpackedArray()) {
        if (!assignmentTarget || !assignmentTarget->isError())
            context.addDiag(diag::EmptyConcatNotAllowed, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (assignmentTarget->isAssociativeArray()) {
        context.addDiag(diag::UnpackedConcatAssociative, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (assignmentTarget->hasFixedRange()) {
        context.addDiag(diag::UnpackedConcatSize, syntax.sourceRange())
            << *assignmentTarget << assignmentTarget->getFixedRange().width() << 0;
        return badExpr(compilation, nullptr);
    }

    return *compilation.emplace<ConcatenationExpression>(*assignmentTarget,
                                                         std::span<const Expression* const>{},
                                                         syntax.sourceRange());
}